

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O0

void __thiscall
dlib::image_dataset_metadata::doc_handler::start_element
          (doc_handler *this,unsigned_long line_number,string *name,attribute_list *atts)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  long *plVar7;
  size_type sVar8;
  string *psVar9;
  string *a;
  long *in_RCX;
  string *in_RDX;
  long in_RDI;
  double dVar10;
  error *e;
  point temp;
  ostringstream sout;
  string_assign *in_stack_ffffffffffffef98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa0;
  value_type *in_stack_ffffffffffffefa8;
  error *in_stack_ffffffffffffefb0;
  error *this_00;
  key_type *in_stack_ffffffffffffefd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe0;
  allocator *paVar11;
  undefined7 in_stack_ffffffffffffefe8;
  undefined1 in_stack_ffffffffffffefef;
  undefined1 local_9e1 [40];
  allocator local_9b9;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [38];
  undefined1 local_96a;
  allocator local_969;
  string local_968 [38];
  undefined1 local_942;
  allocator local_941;
  string local_940 [103];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [38];
  undefined1 local_862;
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_818;
  allocator local_809;
  string local_808 [38];
  undefined1 local_7e2;
  allocator local_7e1;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_798;
  allocator local_789;
  string local_788 [55];
  allocator local_751;
  string local_750 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_730;
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d8;
  allocator local_6c9;
  string local_6c8 [38];
  undefined1 local_6a2;
  allocator local_6a1;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_560;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  allocator local_3f1;
  string local_3f0 [38];
  undefined1 local_3ca;
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  allocator local_371;
  string local_370 [38];
  undefined1 local_34a;
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  allocator local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9;
  ostream local_1a8;
  long *local_20;
  string *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8));
  if (sVar3 == 0) {
    bVar1 = std::operator!=(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar4 = std::operator<<(&local_1a8,
                             "Invalid XML document.  Root tag must be <dataset>.  Found <");
    poVar4 = std::operator<<(poVar4,local_18);
    std::operator<<(poVar4,"> instead.");
    local_1c9 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
    local_1c9 = 0;
    __cxa_throw(uVar5,&error::typeinfo,error::~error);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
  plVar7 = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"top",&local_1f1);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    plVar7 = local_20;
    if ((bVar2 & 1) == 0) {
      local_24a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"<box> missing required attribute \'top\'",&local_249);
      error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
      local_24a = 0;
      __cxa_throw(uVar5,&error::typeinfo,error::~error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"top",&local_221);
    (**(code **)(*plVar7 + 0x50))(plVar7,local_220);
    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                string_assign::operator=
                          (in_stack_ffffffffffffef98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x355062);
    lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                      ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x355089);
    plVar7 = rectangle::top((rectangle *)(in_RDI + 0x58));
    *plVar7 = lVar6;
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"left",&local_271);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_270);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    plVar7 = local_20;
    if ((bVar2 & 1) == 0) {
      local_2ca = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"<box> missing required attribute \'left\'",&local_2c9)
      ;
      error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
      local_2ca = 0;
      __cxa_throw(uVar5,&error::typeinfo,error::~error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"left",&local_2a1);
    (**(code **)(*plVar7 + 0x50))(plVar7,local_2a0);
    local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                string_assign::operator=
                          (in_stack_ffffffffffffef98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x355369);
    lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                      ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x355390);
    plVar7 = rectangle::left((rectangle *)(in_RDI + 0x58));
    *plVar7 = lVar6;
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"width",&local_2f1);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_2f0);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    plVar7 = local_20;
    if ((bVar2 & 1) == 0) {
      local_34a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_348,"<box> missing required attribute \'width\'",&local_349);
      error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
      local_34a = 0;
      __cxa_throw(uVar5,&error::typeinfo,error::~error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"width",&local_321);
    (**(code **)(*plVar7 + 0x50))(plVar7,local_320);
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                string_assign::operator=
                          (in_stack_ffffffffffffef98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x355670);
    lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                      ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x355697);
    plVar7 = rectangle::right((rectangle *)(in_RDI + 0x58));
    *plVar7 = lVar6;
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"height",&local_371);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_370);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    plVar7 = local_20;
    if ((bVar2 & 1) == 0) {
      local_3ca = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c8,"<box> missing required attribute \'height\'",&local_3c9);
      error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
      local_3ca = 0;
      __cxa_throw(uVar5,&error::typeinfo,error::~error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"height",&local_3a1);
    (**(code **)(*plVar7 + 0x50))(plVar7,local_3a0);
    local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                string_assign::operator=
                          (in_stack_ffffffffffffef98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x355977);
    lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                      ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x35599e);
    plVar7 = rectangle::bottom((rectangle *)(in_RDI + 0x58));
    *plVar7 = lVar6;
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"difficult",&local_3f1);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_3f0);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"difficult",&local_421);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_420);
      local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x355c7e);
      bVar1 = string_assign::string_assign_helper::operator_cast_to_bool
                        ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                          *)0x355ca5);
      *(bool *)(in_RDI + 200) = bVar1;
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"truncated",&local_449);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_448);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,"truncated",&local_479);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_478);
      local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x355e80);
      bVar1 = string_assign::string_assign_helper::operator_cast_to_bool
                        ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                          *)0x355ea7);
      *(bool *)(in_RDI + 0xc9) = bVar1;
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"occluded",&local_4a1);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_4a0);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,"occluded",&local_4d1);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_4d0);
      local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x356082);
      bVar1 = string_assign::string_assign_helper::operator_cast_to_bool
                        ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                          *)0x3560a9);
      *(bool *)(in_RDI + 0xca) = bVar1;
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"ignore",&local_4f9);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_4f8);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,"ignore",&local_529);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_528);
      local_508 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x356284);
      bVar1 = string_assign::string_assign_helper::operator_cast_to_bool
                        ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                          *)0x3562ab);
      *(bool *)(in_RDI + 0xcb) = bVar1;
      std::__cxx11::string::~string(local_528);
      std::allocator<char>::~allocator((allocator<char> *)&local_529);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"angle",&local_551);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_550);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,"angle",&local_581);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_580);
      local_560 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x356486);
      dVar10 = string_assign::string_assign_helper::operator_cast_to_double
                         ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                           *)0x3564ad);
      *(double *)(in_RDI + 0xe0) = dVar10;
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a8,"age",&local_5a9);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_5a8);
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,"age",&local_5d9);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_5d8);
      local_5b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x35668b);
      dVar10 = string_assign::string_assign_helper::operator_cast_to_double
                         ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                           *)0x3566b2);
      *(double *)(in_RDI + 0xf0) = dVar10;
      std::__cxx11::string::~string(local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_600,"gender",&local_601);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_600);
    std::__cxx11::string::~string(local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_628,"gender",&local_629);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_628);
      bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
      std::__cxx11::string::~string(local_628);
      std::allocator<char>::~allocator((allocator<char> *)&local_629);
      plVar7 = local_20;
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0xe8) = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_650,"gender",&local_651);
        (**(code **)(*plVar7 + 0x50))(plVar7,local_650);
        bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
        std::__cxx11::string::~string(local_650);
        std::allocator<char>::~allocator((allocator<char> *)&local_651);
        plVar7 = local_20;
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0xe8) = 2;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_678,"gender",&local_679);
          (**(code **)(*plVar7 + 0x50))(plVar7,local_678);
          bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
          std::__cxx11::string::~string(local_678);
          std::allocator<char>::~allocator((allocator<char> *)&local_679);
          if (!bVar1) {
            local_6a2 = 1;
            uVar5 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_6a0,"Invalid gender string in box attribute.",&local_6a1);
            error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
            local_6a2 = 0;
            __cxa_throw(uVar5,&error::typeinfo,error::~error);
          }
          *(undefined4 *)(in_RDI + 0xe8) = 0;
        }
      }
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c8,"pose",&local_6c9);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_6c8);
    std::__cxx11::string::~string(local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    plVar7 = local_20;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6f8,"pose",&local_6f9);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_6f8);
      local_6d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x356d7d);
      dVar10 = string_assign::string_assign_helper::operator_cast_to_double
                         ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                           *)0x356da4);
      *(double *)(in_RDI + 0xd0) = dVar10;
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    }
    plVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"detection_score",&local_721);
    bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_720);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_750,"detection_score",&local_751);
      (**(code **)(*local_20 + 0x50))(local_20,local_750);
      local_730 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  string_assign::operator=
                            (in_stack_ffffffffffffef98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x356f82);
      dVar10 = string_assign::string_assign_helper::operator_cast_to_double
                         ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                           *)0x356fa9);
      *(double *)(in_RDI + 0xd8) = dVar10;
      std::__cxx11::string::~string(local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
    }
    plVar7 = rectangle::top((rectangle *)(in_RDI + 0x58));
    lVar6 = *plVar7;
    plVar7 = rectangle::bottom((rectangle *)(in_RDI + 0x58));
    *plVar7 = *plVar7 + lVar6 + -1;
    plVar7 = rectangle::left((rectangle *)(in_RDI + 0x58));
    lVar6 = *plVar7;
    plVar7 = rectangle::right((rectangle *)(in_RDI + 0x58));
    *plVar7 = lVar6 + -1 + *plVar7;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffefa0);
      bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
      if (bVar1) {
        vector<long,_2L>::vector((vector<long,_2L> *)in_stack_ffffffffffffefa0);
        plVar7 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_788,"x",&local_789);
        bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_788);
        std::__cxx11::string::~string(local_788);
        std::allocator<char>::~allocator((allocator<char> *)&local_789);
        plVar7 = local_20;
        if ((bVar2 & 1) == 0) {
          local_7e2 = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_7e0,"<part> missing required attribute \'x\'",&local_7e1);
          error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
          local_7e2 = 0;
          __cxa_throw(uVar5,&error::typeinfo,error::~error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7b8,"x",&local_7b9);
        (**(code **)(*plVar7 + 0x50))(plVar7,local_7b8);
        local_798 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    string_assign::operator=
                              (in_stack_ffffffffffffef98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x3572c8);
        lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                          ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x3572ef);
        plVar7 = vector<long,_2L>::x((vector<long,_2L> *)0x357306);
        *plVar7 = lVar6;
        std::__cxx11::string::~string(local_7b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
        plVar7 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_808,"y",&local_809);
        bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_808);
        std::__cxx11::string::~string(local_808);
        std::allocator<char>::~allocator((allocator<char> *)&local_809);
        plVar7 = local_20;
        if ((bVar2 & 1) == 0) {
          local_862 = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_860,"<part> missing required attribute \'y\'",&local_861);
          error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
          local_862 = 0;
          __cxa_throw(uVar5,&error::typeinfo,error::~error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_838,"y",&local_839);
        (**(code **)(*plVar7 + 0x50))(plVar7,local_838);
        local_818 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    string_assign::operator=
                              (in_stack_ffffffffffffef98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x3575cb);
        lVar6 = string_assign::string_assign_helper::operator_cast_to_long
                          ((string_assign_helper<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x3575f2);
        plVar7 = vector<long,_2L>::y((vector<long,_2L> *)0x357609);
        *plVar7 = lVar6;
        std::__cxx11::string::~string(local_838);
        std::allocator<char>::~allocator((allocator<char> *)&local_839);
        plVar7 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_888,"name",&local_889);
        bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_888);
        std::__cxx11::string::~string(local_888);
        std::allocator<char>::~allocator((allocator<char> *)&local_889);
        plVar7 = local_20;
        if ((bVar2 & 1) == 0) {
          local_96a = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_968,"<part> missing required attribute \'name\'",&local_969);
          error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
          local_96a = 0;
          __cxa_throw(uVar5,&error::typeinfo,error::~error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8b0,"name",&local_8b1);
        (**(code **)(*plVar7 + 0x50))(plVar7,local_8b0);
        sVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                         *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
        std::__cxx11::string::~string(local_8b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
        if (sVar8 != 0) {
          local_942 = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_940,"name",&local_941);
          (**(code **)(*local_20 + 0x50))(local_20,local_940);
          std::operator+((char *)CONCAT17(in_stack_ffffffffffffefef,in_stack_ffffffffffffefe8),
                         in_stack_ffffffffffffefe0);
          std::operator+(in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0);
          error::error(in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
          local_942 = 0;
          __cxa_throw(uVar5,&error::typeinfo,error::~error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8d8,"name",&local_8d9);
        (**(code **)(*local_20 + 0x50))(local_20,local_8d8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                      *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
        vector<long,_2L>::operator=
                  ((vector<long,_2L> *)in_stack_ffffffffffffefb0,
                   (vector<long,_2L> *)in_stack_ffffffffffffefa8);
        std::__cxx11::string::~string(local_8d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
        goto LAB_003580df;
      }
    }
    bVar1 = std::operator==(in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98);
    if (bVar1) {
      std::
      vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ::clear((vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
               *)0x357d6c);
      paVar11 = &local_991;
      plVar7 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_990,"file",paVar11);
      bVar2 = (**(code **)(*plVar7 + 0x48))(plVar7,local_990);
      std::__cxx11::string::~string(local_990);
      std::allocator<char>::~allocator((allocator<char> *)&local_991);
      if ((bVar2 & 1) == 0) {
        a = (string *)__cxa_allocate_exception(0x30);
        this_00 = (error *)local_9e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_9e1 + 1),"<image> missing required attribute \'file\'",
                   (allocator *)this_00);
        error::error(this_00,a);
        __cxa_throw(a,&error::typeinfo,error::~error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b8,"file",&local_9b9);
      psVar9 = (string *)(**(code **)(*local_20 + 0x50))(local_20,local_9b8);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x20),psVar9);
      std::__cxx11::string::~string(local_9b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
    }
  }
LAB_003580df:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  return;
}

Assistant:

virtual void start_element ( 
                const unsigned long line_number,
                const std::string& name,
                const dlib::attribute_list& atts
            )
            {
                try
                {
                    if (ts.size() == 0) 
                    {
                        if (name != "dataset")
                        {
                            std::ostringstream sout;
                            sout << "Invalid XML document.  Root tag must be <dataset>.  Found <" << name << "> instead.";
                            throw dlib::error(sout.str());
                        }
                        else
                        {
                            ts.push_back(name);
                            return;
                        }
                    }


                    if (name == "box")
                    {
                        if (atts.is_in_list("top")) temp_box.rect.top() = sa = atts["top"];
                        else throw dlib::error("<box> missing required attribute 'top'");

                        if (atts.is_in_list("left")) temp_box.rect.left() = sa = atts["left"];
                        else throw dlib::error("<box> missing required attribute 'left'");

                        if (atts.is_in_list("width")) temp_box.rect.right() = sa = atts["width"];
                        else throw dlib::error("<box> missing required attribute 'width'");

                        if (atts.is_in_list("height")) temp_box.rect.bottom() = sa = atts["height"];
                        else throw dlib::error("<box> missing required attribute 'height'");

                        if (atts.is_in_list("difficult")) temp_box.difficult = sa = atts["difficult"];
                        if (atts.is_in_list("truncated")) temp_box.truncated = sa = atts["truncated"];
                        if (atts.is_in_list("occluded"))  temp_box.occluded  = sa = atts["occluded"];
                        if (atts.is_in_list("ignore"))  temp_box.ignore  = sa = atts["ignore"];
                        if (atts.is_in_list("angle"))  temp_box.angle  = sa = atts["angle"];
                        if (atts.is_in_list("age"))  temp_box.age  = sa = atts["age"];
                        if (atts.is_in_list("gender"))  
                        {
                            if (atts["gender"] == "male")
                                temp_box.gender = MALE;
                            else if (atts["gender"] == "female")
                                temp_box.gender = FEMALE;
                            else if (atts["gender"] == "unknown")
                                temp_box.gender = UNKNOWN;
                            else
                                throw dlib::error("Invalid gender string in box attribute.");
                        }
                        if (atts.is_in_list("pose"))  temp_box.pose  = sa = atts["pose"];
                        if (atts.is_in_list("detection_score"))  temp_box.detection_score  = sa = atts["detection_score"];

                        temp_box.rect.bottom() += temp_box.rect.top()-1;
                        temp_box.rect.right() += temp_box.rect.left()-1;
                    }
                    else if (name == "part" && ts.back() == "box")
                    {
                        point temp;
                        if (atts.is_in_list("x")) temp.x() = sa = atts["x"];
                        else throw dlib::error("<part> missing required attribute 'x'");

                        if (atts.is_in_list("y")) temp.y() = sa = atts["y"];
                        else throw dlib::error("<part> missing required attribute 'y'");

                        if (atts.is_in_list("name")) 
                        {
                            if (temp_box.parts.count(atts["name"])==0)
                            {
                                temp_box.parts[atts["name"]] = temp;
                            }
                            else
                            {
                                throw dlib::error("<part> with name '" + atts["name"] + "' is defined more than one time in a single box.");
                            }
                        }
                        else 
                        {
                            throw dlib::error("<part> missing required attribute 'name'");
                        }
                    }
                    else if (name == "image")
                    {
                        temp_image.boxes.clear();

                        if (atts.is_in_list("file")) temp_image.filename = atts["file"];
                        else throw dlib::error("<image> missing required attribute 'file'");
                    }

                    ts.push_back(name);
                }
                catch (error& e)
                {
                    throw dlib::error("Error on line " + cast_to_string(line_number) + ": " + e.what());
                }
            }